

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void __thiscall clip_model_loader::load_tensors(clip_model_loader *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  gguf_context *pgVar3;
  clip_ctx *pcVar4;
  iterator iVar5;
  pointer pcVar6;
  mapped_type mVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  clip_model_loader *pcVar10;
  clip_model_loader *pcVar11;
  char cVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  mapped_type *pmVar16;
  pointer __p;
  ggml_tensor *pgVar17;
  undefined8 uVar18;
  pointer __p_00;
  size_t sVar19;
  size_type __new_size;
  runtime_error *prVar20;
  int64_t i;
  long lVar21;
  ulong uVar22;
  long *plVar23;
  anon_class_16_2_dbf8b9d2 get_tensor;
  ggml_tensor *cur;
  ifstream fin;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> tensors_to_load;
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_buf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  tensor_offset;
  anon_class_16_2_dbf8b9d2 local_308;
  undefined1 local_2f8 [32];
  key_type local_2d8;
  byte abStack_2b8 [488];
  clip_ctx *local_d0;
  clip_model_loader *local_c8;
  vector<clip_layer,_std::allocator<clip_layer>_> *local_c0;
  long *local_b8;
  long *plStack_b0;
  long local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  string *local_80;
  long local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar21 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = 0;
  local_b8 = (long *)0x0;
  plStack_b0 = (long *)0x0;
  local_c8 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pcVar11 = local_c8;
    lVar13 = gguf_get_n_tensors((local_c8->ctx_gguf)._M_t.
                                super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
    pgVar3 = (pcVar11->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
             .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl;
    if (lVar13 <= lVar21) break;
    pcVar14 = (char *)gguf_get_tensor_name(pgVar3,lVar21);
    lVar13 = gguf_get_data_offset
                       ((local_c8->ctx_gguf)._M_t.
                        super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
    lVar15 = gguf_get_tensor_offset
                       ((local_c8->ctx_gguf)._M_t.
                        super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,lVar21);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,pcVar14,(allocator<char> *)local_2f8);
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            *)&local_60,&local_2d8);
    *pmVar16 = lVar15 + lVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    lVar21 = lVar21 + 1;
  }
  lVar21 = gguf_get_n_tensors(pgVar3);
  local_78 = ggml_tensor_overhead();
  local_78 = local_78 * (lVar21 + 1);
  pcVar4 = pcVar11->ctx_clip;
  uStack_70 = 0;
  local_68 = 1;
  __p = (pointer)ggml_init();
  std::__uniq_ptr_impl<ggml_context,_ggml_context_deleter>::reset
            ((__uniq_ptr_impl<ggml_context,_ggml_context_deleter> *)&pcVar4->ctx_data,__p);
  pcVar4 = pcVar11->ctx_clip;
  if ((pcVar4->ctx_data)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl == (ggml_context *)0x0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_(&local_2d8,"%s: failed to init ggml context\n","load_tensors");
    std::runtime_error::runtime_error(prVar20,(string *)&local_2d8);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_308.tensors_to_load = (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)&local_b8;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_308.this = pcVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"v.class_embd","");
  pcVar10 = local_308.this;
  pgVar17 = (ggml_tensor *)
            ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                            super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            local_2d8._M_dataplus._M_p);
  local_2f8._0_8_ = pgVar17;
  if (pgVar17 == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
      pgVar17 = (ggml_tensor *)local_2f8._0_8_;
    }
    else {
      *iVar5._M_current = pgVar17;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar17);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).class_embedding = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  string_format_abi_cxx11_(&local_2d8,"%s.pre_ln.%s","v","weight");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).pre_ln_w = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  string_format_abi_cxx11_(&local_2d8,"%s.pre_ln.%s","v","bias");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).pre_ln_b = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  string_format_abi_cxx11_(&local_2d8,"%s.post_ln.%s","v","weight");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).post_ln_w = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  string_format_abi_cxx11_(&local_2d8,"%s.post_ln.%s","v","bias");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).post_ln_b = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"v.patch_embd.bias","");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).patch_bias = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"v.patch_embd.weight","");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).patch_embeddings_0 = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"v.patch_embd.weight.1","");
  pcVar10 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).patch_embeddings_1 = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    pgVar17 = (pcVar4->vision_model).patch_embeddings_1;
  }
  if (pgVar17 == (ggml_tensor *)0x0) {
    pcVar11->ctx_clip->has_qwen2vl_merger = false;
  }
  string_format_abi_cxx11_(&local_2d8,"%s.position_embd.weight","v");
  pcVar11 = local_308.this;
  local_2f8._0_8_ =
       ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                       local_2d8._M_dataplus._M_p);
  if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
    pgVar17 = (ggml_tensor *)0x0;
  }
  else {
    iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
    if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
      std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
                ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                 iVar5,(ggml_tensor **)local_2f8);
    }
    else {
      *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
      *(long *)((long)local_308.tensors_to_load + 8) =
           *(long *)((long)local_308.tensors_to_load + 8) + 8;
    }
    pgVar17 = (ggml_tensor *)
              ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                              super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              local_2f8._0_8_);
    ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
  }
  (pcVar4->vision_model).position_embeddings = pgVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_c0 = &(pcVar4->vision_model).layers;
  std::vector<clip_layer,_std::allocator<clip_layer>_>::resize
            (local_c0,(long)(pcVar4->vision_model).hparams.n_layer);
  local_d0 = pcVar4;
  if (0 < (pcVar4->vision_model).hparams.n_layer) {
    lVar21 = 0xa8;
    uVar22 = 0;
    do {
      pcVar6 = (local_c0->super__Vector_base<clip_layer,_std::allocator<clip_layer>_>)._M_impl.
               super__Vector_impl_data._M_start;
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_k.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0xa8) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_q.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0x98) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_v.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0x88) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_out.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0x78) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ln1.%s","v",uVar22 & 0xffffffff,"weight");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x68) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ln2.%s","v",uVar22 & 0xffffffff,"weight");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -8) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_k.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0xa0) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_q.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x90) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_v.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x80) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.attn_out.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x70) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ln1.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x60) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ln2.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)&pcVar6->k_w + lVar21) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_up.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0x38) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_up.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x30) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_gate.%s","v",uVar22 & 0xffffffff,"weight");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x28) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_gate.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x20) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_down.%s","v",uVar22 & 0xffffffff,"weight");
      pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
      *(ggml_tensor **)((long)pcVar6 + lVar21 + -0x18) = pgVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      string_format_abi_cxx11_(&local_2d8,"%s.blk.%d.ffn_down.%s","v",uVar22 & 0xffffffff,"bias");
      pcVar11 = local_308.this;
      local_2f8._0_8_ =
           ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                           super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                           local_2d8._M_dataplus._M_p);
      if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
        uVar18 = 0;
      }
      else {
        iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
        if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
          std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
          _M_realloc_insert<ggml_tensor*const&>
                    ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                     iVar5,(ggml_tensor **)local_2f8);
        }
        else {
          *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
          *(long *)((long)local_308.tensors_to_load + 8) =
               *(long *)((long)local_308.tensors_to_load + 8) + 8;
        }
        uVar18 = ggml_dup_tensor((pcVar11->ctx_clip->ctx_data)._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 local_2f8._0_8_);
        ggml_set_name(uVar18,(char *)(local_2f8._0_8_ + 0x100));
      }
      *(undefined8 *)((long)pcVar6 + lVar21 + -0x10) = uVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      puVar1 = (undefined8 *)((long)pcVar6 + lVar21 + -0x38);
      uVar18 = *puVar1;
      uVar8 = puVar1[1];
      puVar1 = (undefined8 *)((long)pcVar6 + lVar21 + -0x18);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)pcVar6 + lVar21 + -0x58);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      puVar1 = (undefined8 *)((long)pcVar6 + lVar21 + -0x48);
      *puVar1 = uVar18;
      puVar1[1] = uVar8;
      uVar22 = uVar22 + 1;
      lVar21 = lVar21 + 0xb0;
    } while ((long)uVar22 < (long)(local_d0->vision_model).hparams.n_layer);
  }
  pcVar11 = local_c8;
  pcVar4 = local_d0;
  switch(local_c8->ctx_clip->proj_type) {
  case PROJECTOR_TYPE_MLP:
  case PROJECTOR_TYPE_MLP_NORM:
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",0,"weight");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",0,"bias");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_0_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",1,"weight");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",1,"bias");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"weight");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"bias");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_2_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",3,"weight");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_3_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",3,"bias");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_3_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",4,"weight");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_4_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",4,"bias");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).mm_4_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar4->vision_model).mm_3_w != (ggml_tensor *)0x0) {
      pcVar11->ctx_clip->proj_type = PROJECTOR_TYPE_MLP_NORM;
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"model.image_newline","");
    pcVar10 = local_308.this;
    local_2f8._0_8_ =
         ggml_get_tensor(((local_308.this)->ctx_meta)._M_t.
                         super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                         local_2d8._M_dataplus._M_p);
    if ((ggml_tensor *)local_2f8._0_8_ == (ggml_tensor *)0x0) {
      pgVar17 = (ggml_tensor *)0x0;
    }
    else {
      iVar5._M_current = *(ggml_tensor ***)((long)local_308.tensors_to_load + 8);
      if (iVar5._M_current == *(ggml_tensor ***)((long)local_308.tensors_to_load + 0x10)) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)local_308.tensors_to_load,
                   iVar5,(ggml_tensor **)local_2f8);
      }
      else {
        *iVar5._M_current = (ggml_tensor *)local_2f8._0_8_;
        *(long *)((long)local_308.tensors_to_load + 8) =
             *(long *)((long)local_308.tensors_to_load + 8) + 8;
      }
      pgVar17 = (ggml_tensor *)
                ggml_dup_tensor((pcVar10->ctx_clip->ctx_data)._M_t.
                                super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                local_2f8._0_8_);
      ggml_set_name(pgVar17,(char *)(local_2f8._0_8_ + 0x100));
    }
    (pcVar4->vision_model).image_newline = pgVar17;
    break;
  case PROJECTOR_TYPE_LDP:
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",1,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",1,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",3,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_3_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",3,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_3_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,0,"0.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_0_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,0,"1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_0_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,0,"1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_0_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_1_fc1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_1_fc1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc2.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_1_fc2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc2.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_1_fc2_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,2,"0.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_2_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,2,"1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_2_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",1,2,"1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_1_block_2_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,0,"0.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_0_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,0,"1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_0_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,0,"1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_0_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_1_fc1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_1_fc1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc2.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_1_fc2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc2.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_1_fc2_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,2,"0.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_2_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,2,"1.weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_2_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mb_block.%d.block.%d.%s",2,2,"1.bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_block_2_block_2_1_b = pgVar17;
    break;
  case PROJECTOR_TYPE_LDPV2:
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",0,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",0,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_0_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",2,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.mlp.%d.%s",2,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_2_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.peg.%d.%s",0,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_peg_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.model.peg.%d.%s",0,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_peg_0_b = pgVar17;
    break;
  case PROJECTOR_TYPE_RESAMPLER:
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"resampler.pos_embed_k","")
    ;
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_pos_embed_k = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"resampler.query","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_query = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"resampler.proj.weight","")
    ;
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_proj = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"resampler.kv.weight","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_kv_proj = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","q","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_q_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","k","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_k_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","v","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_v_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","q","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_q_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","k","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_k_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","v","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_v_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","out","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_o_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.attn.%s.%s","out","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_attn_o_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","q","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_q_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","q","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_q_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","kv","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_kv_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","kv","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_kv_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","post","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_post_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"resampler.ln_%s.%s","post","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_post_b = pgVar17;
    break;
  case PROJECTOR_TYPE_GLM_EDGE:
    string_format_abi_cxx11_(&local_2d8,"adapter.conv.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_adapter_conv_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.conv.%s","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_adapter_conv_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.linear.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.norm1.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_q_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.norm1.%s","bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_ln_q_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.dense_h_to_4h.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.gate.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"adapter.linear.dense_4h_to_h.%s","weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_model_mlp_3_w = pgVar17;
    break;
  case PROJECTOR_TYPE_MERGER:
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",0,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_0_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",0,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_0_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_1_b = pgVar17;
    break;
  case PROJECTOR_TYPE_GEMMA3:
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"mm.input_projection.weight","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_input_proj_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"mm.soft_emb_norm.weight","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_soft_emb_norm_w = pgVar17;
    break;
  case PROJECTOR_TYPE_IDEFICS3:
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"mm.model.fc.weight","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).projection = pgVar17;
    break;
  case PROJECTOR_TYPE_PIXTRAL:
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",1,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_1_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",1,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_1_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"weight");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_2_w = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    string_format_abi_cxx11_(&local_2d8,"mm.%d.%s",2,"bias");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).mm_2_b = pgVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"v.token_embd.img_break","");
    pgVar17 = load_tensors::anon_class_16_2_dbf8b9d2::operator()(&local_308,&local_2d8,true);
    (pcVar4->vision_model).token_embd_img_break = pgVar17;
    break;
  default:
    uVar18 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                        ,0x6c3,"GGML_ASSERT(%s) failed","false && \"unknown projector type\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (long *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    _Unwind_Resume(uVar18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&local_2d8,(string *)&pcVar11->fname,_S_bin);
  local_80 = &pcVar11->fname;
  if ((abStack_2b8[*(long *)(local_2d8._M_dataplus._M_p + -0x18)] & 5) != 0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              ((string *)local_2f8,"%s: failed to open %s\n","load_tensors",
               (local_80->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar20,(string *)local_2f8);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d0 = (clip_ctx *)ggml_backend_get_default_buffer_type(pcVar11->ctx_clip->backend);
  pcVar4 = pcVar11->ctx_clip;
  __p_00 = (pointer)ggml_backend_alloc_ctx_tensors_from_buft
                              ((pcVar4->ctx_data)._M_t.
                               super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,local_d0);
  std::__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
            ((__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&pcVar4->buf,
             __p_00);
  ggml_backend_buffer_set_usage
            ((pcVar11->ctx_clip->buf)._M_t.
             super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
             super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl,1);
  local_c0 = (vector<clip_layer,_std::allocator<clip_layer>_> *)plStack_b0;
  if (local_b8 != plStack_b0) {
    plVar23 = local_b8;
    do {
      lVar13 = ggml_get_tensor((local_c8->ctx_clip->ctx_data)._M_t.
                               super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                               *plVar23 + 0x100);
      lVar21 = *plVar23;
      pcVar14 = (char *)(lVar21 + 0x100);
      local_2f8._0_8_ = local_2f8 + 0x10;
      sVar19 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,pcVar14,lVar21 + sVar19 + 0x100);
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)&local_60,(key_type *)local_2f8);
      mVar7 = *pmVar16;
      if ((ggml_tensor *)local_2f8._0_8_ != (ggml_tensor *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
      }
      std::istream::seekg((long)&local_2d8,(_Ios_Seekdir)mVar7);
      if ((abStack_2b8[*(long *)(local_2d8._M_dataplus._M_p + -0x18)] & 5) != 0) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        string_format_abi_cxx11_
                  ((string *)local_2f8,"%s: failed to seek for tensor %s\n","load_tensors",
                   *plVar23 + 0x100);
        std::runtime_error::runtime_error(prVar20,(string *)local_2f8);
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __new_size = ggml_nbytes(lVar13);
      cVar12 = ggml_backend_buft_is_host(local_d0);
      if (cVar12 == '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_98,__new_size);
        std::istream::read((char *)&local_2d8,
                           (long)local_98.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
        ggml_backend_tensor_set
                  (lVar13,local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,0,__new_size);
      }
      else {
        std::istream::read((char *)&local_2d8,*(long *)(lVar13 + 0xf8));
      }
      plVar23 = plVar23 + 1;
    } while ((vector<clip_layer,_std::allocator<clip_layer>_> *)plVar23 != local_c0);
  }
  std::ifstream::close();
  if ((int)g_logger_state.verbosity_thold < 2) {
    clip_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: loaded %zu tensors from %s\n","load_tensors",
                      (long)plStack_b0 - (long)local_b8 >> 3,(local_80->_M_dataplus)._M_p);
  }
  std::ifstream::~ifstream(&local_2d8);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8 != (long *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void load_tensors() {
        std::map<std::string, size_t> tensor_offset;
        std::vector<ggml_tensor *> tensors_to_load;

        // get offsets
        for (int64_t i = 0; i < gguf_get_n_tensors(ctx_gguf.get()); ++i) {
            const char * name = gguf_get_tensor_name(ctx_gguf.get(), i);
            tensor_offset[name] = gguf_get_data_offset(ctx_gguf.get()) + gguf_get_tensor_offset(ctx_gguf.get(), i);
        }

        // create data context
        struct ggml_init_params params = {
            /*.mem_size =*/ (gguf_get_n_tensors(ctx_gguf.get()) + 1) * ggml_tensor_overhead(),
            /*.mem_buffer =*/ NULL,
            /*.no_alloc =*/ true,
        };
        ctx_clip.ctx_data.reset(ggml_init(params));
        if (!ctx_clip.ctx_data) {
            throw std::runtime_error(string_format("%s: failed to init ggml context\n", __func__));
        }

        // helper function
        auto get_tensor = [&](const std::string & name, bool required = true) {
            struct ggml_tensor * cur = ggml_get_tensor(ctx_meta.get(), name.c_str());
            if (!cur && required) {
                throw std::runtime_error(string_format("%s: unable to find tensor %s\n", __func__, name.c_str()));
            }
            if (cur) {
                tensors_to_load.push_back(cur);
                // add tensors to context
                struct ggml_tensor * data_tensor = ggml_dup_tensor(ctx_clip.ctx_data.get(), cur);
                ggml_set_name(data_tensor, cur->name);
                cur = data_tensor;
            }
            return cur;
        };

        auto & vision_model = ctx_clip.vision_model;

        vision_model.class_embedding = get_tensor(TN_CLASS_EMBD, false);

        vision_model.pre_ln_w = get_tensor(string_format(TN_LN_PRE, "v", "weight"), false);
        vision_model.pre_ln_b = get_tensor(string_format(TN_LN_PRE, "v", "bias"),   false);

        vision_model.post_ln_w = get_tensor(string_format(TN_LN_POST, "v", "weight"), false);
        vision_model.post_ln_b = get_tensor(string_format(TN_LN_POST, "v", "bias"),   false);

        vision_model.patch_bias = get_tensor(TN_PATCH_BIAS, false);
        vision_model.patch_embeddings_0 = get_tensor(TN_PATCH_EMBD,   false);
        vision_model.patch_embeddings_1 = get_tensor(TN_PATCH_EMBD_1, false);
        if (vision_model.patch_embeddings_1 == nullptr) {
            ctx_clip.has_qwen2vl_merger = false;
        }

        vision_model.position_embeddings = get_tensor(string_format(TN_POS_EMBD, "v"), false);

        // layers
        vision_model.layers.resize(vision_model.hparams.n_layer);
        for (int il = 0; il < vision_model.hparams.n_layer; ++il) {
            auto & layer = vision_model.layers[il];
            layer.k_w    = get_tensor(string_format(TN_ATTN_K,      "v", il, "weight"));
            layer.q_w    = get_tensor(string_format(TN_ATTN_Q,      "v", il, "weight"));
            layer.v_w    = get_tensor(string_format(TN_ATTN_V,      "v", il, "weight"));
            layer.o_w    = get_tensor(string_format(TN_ATTN_OUTPUT, "v", il, "weight"));
            layer.ln_1_w = get_tensor(string_format(TN_LN_1,        "v", il, "weight"), false);
            layer.ln_2_w = get_tensor(string_format(TN_LN_2,        "v", il, "weight"), false);
            layer.k_b    = get_tensor(string_format(TN_ATTN_K,      "v", il, "bias"), false);
            layer.q_b    = get_tensor(string_format(TN_ATTN_Q,      "v", il, "bias"), false);
            layer.v_b    = get_tensor(string_format(TN_ATTN_V,      "v", il, "bias"), false);
            layer.o_b    = get_tensor(string_format(TN_ATTN_OUTPUT, "v", il, "bias"), false);
            layer.ln_1_b = get_tensor(string_format(TN_LN_1,        "v", il, "bias"), false);
            layer.ln_2_b = get_tensor(string_format(TN_LN_2,        "v", il, "bias"), false);

            // new naming
            layer.ff_up_w   = get_tensor(string_format(TN_FFN_UP,   "v", il, "weight"));
            layer.ff_up_b   = get_tensor(string_format(TN_FFN_UP,   "v", il, "bias"),   false);
            layer.ff_gate_w = get_tensor(string_format(TN_FFN_GATE, "v", il, "weight"), false);
            layer.ff_gate_b = get_tensor(string_format(TN_FFN_GATE, "v", il, "bias"),   false);
            layer.ff_down_w = get_tensor(string_format(TN_FFN_DOWN, "v", il, "weight"));
            layer.ff_down_b = get_tensor(string_format(TN_FFN_DOWN, "v", il, "bias"),   false);

            // legacy naming (the in and out is reversed! don't ask me why)
            layer.ff_i_w = layer.ff_down_w;
            layer.ff_o_w = layer.ff_up_w;
            layer.ff_i_b = layer.ff_down_b;
            layer.ff_o_b = layer.ff_up_b;
        }

        switch (ctx_clip.proj_type) {
            case PROJECTOR_TYPE_MLP:
            case PROJECTOR_TYPE_MLP_NORM:
                {
                    // LLaVA projection
                    vision_model.mm_0_w = get_tensor(string_format(TN_LLAVA_PROJ, 0, "weight"), false);
                    vision_model.mm_0_b = get_tensor(string_format(TN_LLAVA_PROJ, 0, "bias"), false);
                    // Yi-type llava
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 1, "weight"), false);
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 1, "bias"), false);
                    // missing in Yi-type llava
                    vision_model.mm_2_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"), false);
                    vision_model.mm_2_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"), false);
                    // Yi-type llava
                    vision_model.mm_3_w = get_tensor(string_format(TN_LLAVA_PROJ, 3, "weight"), false);
                    vision_model.mm_3_b = get_tensor(string_format(TN_LLAVA_PROJ, 3, "bias"), false);
                    vision_model.mm_4_w = get_tensor(string_format(TN_LLAVA_PROJ, 4, "weight"), false);
                    vision_model.mm_4_b = get_tensor(string_format(TN_LLAVA_PROJ, 4, "bias"), false);
                    if (vision_model.mm_3_w) {
                        // TODO: this is a hack to support Yi-type llava
                        ctx_clip.proj_type = PROJECTOR_TYPE_MLP_NORM;
                    }
                    vision_model.image_newline = get_tensor(TN_IMAGE_NEWLINE, false);
                } break;
            case PROJECTOR_TYPE_LDP:
                {
                    // MobileVLM projection
                    vision_model.mm_model_mlp_1_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 1, "weight"));
                    vision_model.mm_model_mlp_1_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 1, "bias"));
                    vision_model.mm_model_mlp_3_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 3, "weight"));
                    vision_model.mm_model_mlp_3_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 3, "bias"));
                    vision_model.mm_model_block_1_block_0_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "0.weight"));
                    vision_model.mm_model_block_1_block_0_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "1.weight"));
                    vision_model.mm_model_block_1_block_0_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "1.bias"));
                    vision_model.mm_model_block_1_block_1_fc1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc1.weight"));
                    vision_model.mm_model_block_1_block_1_fc1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc1.bias"));
                    vision_model.mm_model_block_1_block_1_fc2_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc2.weight"));
                    vision_model.mm_model_block_1_block_1_fc2_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc2.bias"));
                    vision_model.mm_model_block_1_block_2_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "0.weight"));
                    vision_model.mm_model_block_1_block_2_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "1.weight"));
                    vision_model.mm_model_block_1_block_2_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "1.bias"));
                    vision_model.mm_model_block_2_block_0_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "0.weight"));
                    vision_model.mm_model_block_2_block_0_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "1.weight"));
                    vision_model.mm_model_block_2_block_0_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "1.bias"));
                    vision_model.mm_model_block_2_block_1_fc1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc1.weight"));
                    vision_model.mm_model_block_2_block_1_fc1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc1.bias"));
                    vision_model.mm_model_block_2_block_1_fc2_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc2.weight"));
                    vision_model.mm_model_block_2_block_1_fc2_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc2.bias"));
                    vision_model.mm_model_block_2_block_2_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "0.weight"));
                    vision_model.mm_model_block_2_block_2_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "1.weight"));
                    vision_model.mm_model_block_2_block_2_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "1.bias"));
                } break;
            case PROJECTOR_TYPE_LDPV2:
                {
                    // MobilVLM_V2 projection
                    vision_model.mm_model_mlp_0_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 0, "weight"));
                    vision_model.mm_model_mlp_0_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 0, "bias"));
                    vision_model.mm_model_mlp_2_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 2, "weight"));
                    vision_model.mm_model_mlp_2_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 2, "bias"));
                    vision_model.mm_model_peg_0_w = get_tensor(string_format(TN_MVLM_PROJ_PEG, 0, "weight"));
                    vision_model.mm_model_peg_0_b = get_tensor(string_format(TN_MVLM_PROJ_PEG, 0, "bias"));
                } break;
            case PROJECTOR_TYPE_RESAMPLER:
                {
                    // vision_model.mm_model_pos_embed = get_tensor(new_clip->ctx_data, TN_MINICPMV_POS_EMBD);
                    vision_model.mm_model_pos_embed_k = get_tensor(TN_MINICPMV_POS_EMBD_K);
                    vision_model.mm_model_query = get_tensor(TN_MINICPMV_QUERY);
                    vision_model.mm_model_proj = get_tensor(TN_MINICPMV_PROJ);
                    vision_model.mm_model_kv_proj = get_tensor(TN_MINICPMV_KV_PROJ);
                    vision_model.mm_model_attn_q_w = get_tensor(string_format(TN_MINICPMV_ATTN, "q", "weight"));
                    vision_model.mm_model_attn_k_w = get_tensor(string_format(TN_MINICPMV_ATTN, "k", "weight"));
                    vision_model.mm_model_attn_v_w = get_tensor(string_format(TN_MINICPMV_ATTN, "v", "weight"));
                    vision_model.mm_model_attn_q_b = get_tensor(string_format(TN_MINICPMV_ATTN, "q", "bias"));
                    vision_model.mm_model_attn_k_b = get_tensor(string_format(TN_MINICPMV_ATTN, "k", "bias"));
                    vision_model.mm_model_attn_v_b = get_tensor(string_format(TN_MINICPMV_ATTN, "v", "bias"));
                    vision_model.mm_model_attn_o_w = get_tensor(string_format(TN_MINICPMV_ATTN, "out", "weight"));
                    vision_model.mm_model_attn_o_b = get_tensor(string_format(TN_MINICPMV_ATTN, "out", "bias"));
                    vision_model.mm_model_ln_q_w = get_tensor(string_format(TN_MINICPMV_LN, "q", "weight"));
                    vision_model.mm_model_ln_q_b = get_tensor(string_format(TN_MINICPMV_LN, "q", "bias"));
                    vision_model.mm_model_ln_kv_w = get_tensor(string_format(TN_MINICPMV_LN, "kv", "weight"));
                    vision_model.mm_model_ln_kv_b = get_tensor(string_format(TN_MINICPMV_LN, "kv", "bias"));
                    vision_model.mm_model_ln_post_w = get_tensor(string_format(TN_MINICPMV_LN, "post", "weight"));
                    vision_model.mm_model_ln_post_b = get_tensor(string_format(TN_MINICPMV_LN, "post", "bias"));
                } break;
            case PROJECTOR_TYPE_GLM_EDGE:
                {
                    vision_model.mm_model_adapter_conv_w = get_tensor(string_format(TN_GLM_ADAPER_CONV, "weight"));
                    vision_model.mm_model_adapter_conv_b = get_tensor(string_format(TN_GLM_ADAPER_CONV, "bias"));
                    vision_model.mm_model_mlp_0_w = get_tensor(string_format(TN_GLM_ADAPTER_LINEAR,"weight"));
                    vision_model.mm_model_ln_q_w = get_tensor(string_format(TN_GLM_ADAPTER_NORM_1,"weight"));
                    vision_model.mm_model_ln_q_b = get_tensor(string_format(TN_GLM_ADAPTER_NORM_1,"bias"));
                    vision_model.mm_model_mlp_1_w = get_tensor(string_format(TN_GLM_ADAPTER_D_H_2_4H,"weight"));
                    vision_model.mm_model_mlp_2_w = get_tensor(string_format(TN_GLM_ADAPTER_GATE,"weight"));
                    vision_model.mm_model_mlp_3_w = get_tensor(string_format(TN_GLM_ADAPTER_D_4H_2_H,"weight"));
                } break;
            case PROJECTOR_TYPE_MERGER:
                {
                    vision_model.mm_0_w = get_tensor(string_format(TN_LLAVA_PROJ, 0, "weight"));
                    vision_model.mm_0_b = get_tensor(string_format(TN_LLAVA_PROJ, 0, "bias"));
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"));
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"));
                } break;
            case PROJECTOR_TYPE_GEMMA3:
                {
                    vision_model.mm_input_proj_w = get_tensor(TN_MM_INP_PROJ);
                    vision_model.mm_soft_emb_norm_w = get_tensor(TN_MM_SOFT_EMB_N);
                } break;
            case PROJECTOR_TYPE_IDEFICS3:
                {
                    vision_model.projection = get_tensor(TN_MM_PROJECTOR);
                } break;
            case PROJECTOR_TYPE_PIXTRAL:
                {
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 1, "weight"));
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 1, "bias"));
                    vision_model.mm_2_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"));
                    vision_model.mm_2_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"));
                    // [IMG_BREAK] token embedding
                    vision_model.token_embd_img_break = get_tensor(TN_TOK_IMG_BREAK);
                } break;
            default:
                GGML_ASSERT(false && "unknown projector type");
        }

        // load data
        {
            std::vector<uint8_t> read_buf;

            auto fin = std::ifstream(fname, std::ios::binary);
            if (!fin) {
                throw std::runtime_error(string_format("%s: failed to open %s\n", __func__, fname.c_str()));
            }

            // alloc memory and offload data
            ggml_backend_buffer_type_t buft = ggml_backend_get_default_buffer_type(ctx_clip.backend);
            ctx_clip.buf.reset(ggml_backend_alloc_ctx_tensors_from_buft(ctx_clip.ctx_data.get(), buft));
            ggml_backend_buffer_set_usage(ctx_clip.buf.get(), GGML_BACKEND_BUFFER_USAGE_WEIGHTS);
            for (auto & t : tensors_to_load) {
                struct ggml_tensor * cur = ggml_get_tensor(ctx_clip.ctx_data.get(), t->name);
                const size_t offset = tensor_offset[t->name];
                fin.seekg(offset, std::ios::beg);
                if (!fin) {
                    throw std::runtime_error(string_format("%s: failed to seek for tensor %s\n", __func__, t->name));
                }
                size_t num_bytes = ggml_nbytes(cur);
                if (ggml_backend_buft_is_host(buft)) {
                    // for the CPU and Metal backend, we can read directly into the tensor
                    fin.read(reinterpret_cast<char *>(cur->data), num_bytes);
                } else {
                    // read into a temporary buffer first, then copy to device memory
                    read_buf.resize(num_bytes);
                    fin.read(reinterpret_cast<char *>(read_buf.data()), num_bytes);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, num_bytes);
                }
            }
            fin.close();

            LOG_DBG("%s: loaded %zu tensors from %s\n", __func__, tensors_to_load.size(), fname.c_str());
        }
    }